

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O0

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::
attach(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
       *this,ObserverBase *observer)

{
  long in_RSI;
  const_iterator in_RDI;
  list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
  *in_stack_ffffffffffffffb8;
  _List_node_base **this_00;
  iterator local_28;
  _List_const_iterator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>
  local_20;
  _List_node_base *local_18;
  long local_10;
  
  local_10 = in_RSI;
  bits::Lock::lock((Lock *)0x2b6371);
  this_00 = &(in_RDI._M_node)->_M_prev;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  _List_const_iterator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>
  ::_List_const_iterator(&local_20,&local_28);
  local_18 = (_List_node_base *)
             std::__cxx11::
             list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
             ::insert((list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
                       *)this_00,in_RDI,(value_type *)in_stack_ffffffffffffffb8);
  *(_List_node_base **)(local_10 + 0x10) = local_18;
  *(_List_node_base **)(local_10 + 8) = in_RDI._M_node;
  bits::Lock::unlock((Lock *)0x2b63e7);
  return;
}

Assistant:

void attach(ObserverBase& observer) {
    _lock.lock();
    observer._index    = _observers.insert(_observers.begin(), &observer);
    observer._notifier = this;
    _lock.unlock();
  }